

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,SVectorBase<double> *b)

{
  int iVar1;
  element_type *this_00;
  double *rhs;
  int *idx;
  double *vec;
  SSVectorBase<double> *in_RSI;
  double in_RDI;
  SSVectorBase<double> *pSVar2;
  int n;
  int sz;
  double epsilon;
  CLUFactor<double> *in_stack_ffffffffffffff78;
  int rn;
  SSVectorBase<double> *in_stack_ffffffffffffff80;
  CLUFactor<double> *this_01;
  SSVectorBase<double> *local_20;
  SSVectorBase<double> *local_10;
  
  this_01 = (CLUFactor<double> *)&stack0xffffffffffffffd0;
  local_10 = in_RSI;
  CLUFactor<double>::tolerances(in_stack_ffffffffffffff78);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x28a023);
  pSVar2 = (SSVectorBase<double> *)Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x28a03d);
  local_20 = pSVar2;
  (**(code **)(**(long **)((long)in_RDI + 0x388) + 0x18))();
  SSVectorBase<double>::assign<double>(pSVar2,(SVectorBase<double> *)this_01);
  SSVectorBase<double>::clear(in_stack_ffffffffffffff80);
  SSVectorBase<double>::size((SSVectorBase<double> *)0x28a08c);
  rn = (int)((ulong)((long)in_RDI + 0x10) >> 0x20);
  pSVar2 = local_20;
  rhs = SSVectorBase<double>::altValues(local_20);
  idx = SSVectorBase<double>::altIndexMem(pSVar2);
  vec = SSVectorBase<double>::altValues(pSVar2);
  SSVectorBase<double>::altIndexMem(pSVar2);
  iVar1 = CLUFactor<double>::vSolveLeft(this_01,in_RDI,vec,idx,rhs,(int *)pSVar2,rn);
  if (iVar1 < 1) {
    SSVectorBase<double>::unSetup(local_10);
  }
  else {
    SSVectorBase<double>::setSize(pSVar2,rn);
    SSVectorBase<double>::forceSetup(local_10);
  }
  SSVectorBase<double>::setSize(pSVar2,rn);
  SSVectorBase<double>::forceSetup((SSVectorBase<double> *)((long)in_RDI + 0x278));
  *(int *)((long)in_RDI + 0x394) = *(int *)((long)in_RDI + 0x394) + 1;
  (**(code **)(**(long **)((long)in_RDI + 0x388) + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{
   R epsilon = this->tolerances()->epsilon();

   solveTime->start();

   // copy to SSVec is done to avoid having to deal with the Nonzero datatype
   // TODO change SVec to standard sparse format
   ssvec.assign(b);

   x.clear();
   int sz = ssvec.size(); // see .altValues()
   int n = this->vSolveLeft(epsilon, x.altValues(), x.altIndexMem(),
                            ssvec.altValues(), ssvec.altIndexMem(), sz);

   if(n > 0)
   {
      x.setSize(n);
      x.forceSetup();
   }
   else
      x.unSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount++;
   solveTime->stop();
}